

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printShortStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *os)

{
  ostream *poVar1;
  ostream *poVar2;
  ostream *in_RSI;
  ostream *in_RDI;
  double dVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000018;
  ostream *in_stack_00000020;
  undefined8 in_stack_ffffffffffffff88;
  int iVar4;
  ostream *in_stack_ffffffffffffff98;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffc8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  printStatus(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(Status)((ulong)in_RDI >> 0x20));
  SPxOut::setFixed(in_RDI,iVar4);
  poVar1 = std::operator<<(in_RSI,"Solving time (sec)  : ");
  dVar3 = (double)(**(code **)(**(long **)(*(long *)(in_RDI + 0x20) + 8) + 0x30))();
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  iVar4 = (int)((ulong)poVar1 >> 0x20);
  poVar1 = std::operator<<(poVar2,"\n");
  poVar1 = std::operator<<(poVar1,"Iterations          : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(*(long *)(in_RDI + 0x20) + 0xb8));
  std::operator<<(poVar1,"\n");
  SPxOut::setScientific(in_RDI,iVar4);
  std::operator<<(in_RSI,"Objective value     : ");
  objValueReal(in_stack_ffffffffffffffc8);
  poVar1 = boost::multiprecision::operator<<(in_stack_00000020,in_stack_00000018);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void SoPlexBase<R>::printShortStatistics(std::ostream& os)
{
   printStatus(os, _status);
   SPxOut::setFixed(os, 2);
   os << "Solving time (sec)  : " << this->_statistics->solvingTime->time() << "\n"
      << "Iterations          : " << this->_statistics->iterations << "\n";
   SPxOut::setScientific(os);
   os << "Objective value     : " << objValueReal() << "\n";
}